

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kernel.h
# Opt level: O0

bool __thiscall pugg::Kernel::add_driver(Kernel *this,Driver *driver)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  pointer ppVar4;
  mapped_type *this_00;
  string local_88;
  unique_ptr<pugg::Driver,_std::default_delete<pugg::Driver>_> local_68;
  _Self local_60 [3];
  string local_48;
  _Self local_28;
  iterator server_iter;
  Driver *driver_local;
  Kernel *this_local;
  
  if (driver == (Driver *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    server_iter._M_node = (_Base_ptr)driver;
    Driver::server_name_abi_cxx11_(&local_48,driver);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pugg::detail::Server,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pugg::detail::Server>_>_>
         ::find(&this->_servers,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    local_60[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pugg::detail::Server,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pugg::detail::Server>_>_>
         ::end(&this->_servers);
    bVar2 = std::operator==(&local_28,local_60);
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pugg::detail::Server>_>
               ::operator->(&local_28);
      iVar1 = (ppVar4->second).min_driver_version;
      iVar3 = Driver::version((Driver *)server_iter._M_node);
      if (iVar3 < iVar1) {
        this_local._7_1_ = false;
      }
      else {
        std::unique_ptr<pugg::Driver,std::default_delete<pugg::Driver>>::
        unique_ptr<std::default_delete<pugg::Driver>,void>
                  ((unique_ptr<pugg::Driver,std::default_delete<pugg::Driver>> *)&local_68,
                   (pointer)server_iter._M_node);
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pugg::detail::Server>_>
                 ::operator->(&local_28);
        Driver::name_abi_cxx11_(&local_88,(Driver *)server_iter._M_node);
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pugg::Driver,_std::default_delete<pugg::Driver>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pugg::Driver,_std::default_delete<pugg::Driver>_>_>_>_>
                  ::operator[](&(ppVar4->second).drivers,&local_88);
        std::unique_ptr<pugg::Driver,_std::default_delete<pugg::Driver>_>::operator=
                  (this_00,&local_68);
        std::__cxx11::string::~string((string *)&local_88);
        std::unique_ptr<pugg::Driver,_std::default_delete<pugg::Driver>_>::~unique_ptr(&local_68);
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool add_driver(pugg::Driver *driver)
  {
    if (!driver)
      return false;

    auto server_iter = _servers.find(driver->server_name());

    if (server_iter == _servers.end())
      return false;

    if (server_iter->second.min_driver_version > driver->version())
      return false;

    server_iter->second.drivers[driver->name()] = std::unique_ptr<pugg::Driver>(driver);
    return true;
  }